

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

Status __thiscall HighsLpRelaxation::run(HighsLpRelaxation *this,bool resolve_on_error)

{
  HighsModelStatus HVar1;
  undefined1 uVar2;
  HighsInt HVar3;
  double *pdVar4;
  HighsBasis *pHVar5;
  int *piVar6;
  HighsModelStatus *pHVar7;
  pointer pHVar8;
  HighsLp *pHVar9;
  Highs *pHVar10;
  undefined8 uVar11;
  size_t in_RCX;
  HighsLogOptions *log_options_;
  char *value;
  void *__buf;
  void *__buf_00;
  byte in_SIL;
  long *in_RDI;
  double dVar12;
  double extraout_XMM0_Qa;
  Highs ipm;
  HighsModelStatus model_status;
  Status retval;
  HighsInt itercount;
  HighsInfo *info;
  HighsStatus callstatus;
  bool detailed_simplex_logging;
  bool solver_logging;
  bool dev_report;
  HighsInt simplex_solve_clock;
  bool valid_basis;
  double this_time_limit;
  undefined4 in_stack_ffffffffffffa7a8;
  HighsInt in_stack_ffffffffffffa7ac;
  HighsLpRelaxation *in_stack_ffffffffffffa7b0;
  Highs *in_stack_ffffffffffffa7b8;
  undefined8 in_stack_ffffffffffffa7e8;
  HighsMipAnalysis *in_stack_ffffffffffffa7f0;
  HighsLpRelaxation *in_stack_ffffffffffffa800;
  allocator *paVar13;
  undefined8 in_stack_ffffffffffffa818;
  int solution_source;
  double dVar14;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa820;
  HighsMipSolverData *in_stack_ffffffffffffa828;
  HighsLp *in_stack_ffffffffffffa830;
  string *in_stack_ffffffffffffa840;
  Highs *in_stack_ffffffffffffa848;
  Highs *in_stack_ffffffffffffa850;
  string *in_stack_ffffffffffffa858;
  string *value_00;
  string *in_stack_ffffffffffffa860;
  string *option;
  Highs *in_stack_ffffffffffffa868;
  string local_5768 [39];
  allocator local_5741;
  string local_5740 [39];
  allocator local_5719;
  string *in_stack_ffffffffffffa8e8;
  HighsLpRelaxation *in_stack_ffffffffffffa8f0;
  Highs *in_stack_ffffffffffffa8f8;
  undefined1 local_5359 [40];
  allocator local_5331;
  string local_5330 [39];
  allocator local_5309;
  string local_5308 [39];
  allocator local_52e1;
  string local_52e0 [144];
  HighsLp *in_stack_ffffffffffffafa8;
  Highs *in_stack_ffffffffffffafb0;
  allocator local_f9;
  string local_f8 [32];
  Status local_d8;
  undefined1 local_d1 [40];
  undefined1 local_a9 [33];
  int local_88;
  int local_84;
  HighsInfo *local_80;
  HighsStatus local_74;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined4 local_6c;
  byte local_65;
  allocator local_51;
  string local_50 [32];
  double local_30;
  double local_28;
  undefined1 resolve_on_error_00;
  undefined7 in_stack_ffffffffffffffe8;
  Status local_4;
  
  solution_source = (int)((ulong)in_stack_ffffffffffffa818 >> 0x20);
  HVar3 = (HighsInt)((ulong)in_stack_ffffffffffffa7e8 >> 0x20);
  uVar2 = in_SIL & 1;
  dVar12 = Highs::getRunTime((Highs *)0x60880c);
  dVar14 = *(double *)(*(long *)(*in_RDI + 8) + 0x88);
  HighsTimer::read((HighsTimer *)(*in_RDI + 0x168),0,__buf,in_RCX);
  local_28 = (dVar12 + dVar14) - extraout_XMM0_Qa;
  local_30 = 0.0;
  pdVar4 = std::max<double>(&local_28,&local_30);
  resolve_on_error_00 = (undefined1)((ulong)*pdVar4 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"time_limit",&local_51);
  Highs::setOptionValue
            (in_stack_ffffffffffffa7b8,(string *)in_stack_ffffffffffffa7b0,
             (double)CONCAT44(in_stack_ffffffffffffa7ac,in_stack_ffffffffffffa7a8));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pHVar5 = Highs::getBasis((Highs *)(in_RDI + 1));
  local_65 = pHVar5->valid & 1;
  local_6c = 0x3a;
  if (local_65 != 0) {
    local_6c = 0x39;
  }
  local_6d = 0;
  local_6e = 0;
  local_6f = 0;
  HighsMipAnalysis::mipTimerStart(in_stack_ffffffffffffa7f0,HVar3);
  local_74 = Highs::run(in_stack_ffffffffffffa7b8);
  HighsMipAnalysis::mipTimerStop(in_stack_ffffffffffffa7f0,HVar3);
  if ((((*(byte *)(*in_RDI + 0x130) & 1) != 0) && ((local_65 & 1) == 0)) &&
     (HVar3 = HighsMipAnalysis::mipTimerNumCall
                        ((HighsMipAnalysis *)in_stack_ffffffffffffa7b8,
                         (HighsInt)((ulong)in_stack_ffffffffffffa7b0 >> 0x20)), HVar3 == 1)) {
    log_options_ = (HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380);
    HighsTimer::read((HighsTimer *)(*in_RDI + 0x168),0,__buf_00,(size_t)log_options_);
    highsLogUser(log_options_,kInfo,"MIP-Timing: %11.2g - return from first root LP solve\n");
  }
  local_80 = Highs::getInfo((Highs *)(in_RDI + 1));
  local_88 = 0;
  piVar6 = std::max<int>(&local_88,&(local_80->super_HighsInfoStruct).simplex_iteration_count);
  local_84 = *piVar6;
  in_RDI[0xa70] = (long)local_84 + in_RDI[0xa70];
  if (local_74 != kError) {
    pHVar7 = Highs::getModelStatus((Highs *)(in_RDI + 1));
    HVar1 = *pHVar7;
    value = (char *)(ulong)(HVar1 - kOptimal);
    switch(value) {
    case (char *)0x1:
      in_RDI[0xa73] = in_RDI[0xa73] + 1;
      in_RDI[0xa72] =
           (long)(((double)local_84 - (double)in_RDI[0xa72]) / (double)in_RDI[0xa73] +
                 (double)in_RDI[0xa72]);
      storeDualInfProof(in_stack_ffffffffffffa8f0);
      local_4 = kInfeasible;
      break;
    default:
      pHVar10 = (Highs *)(*(long *)(*in_RDI + 8) + 0x380);
      Highs::modelStatusToString_abi_cxx11_(pHVar10,(HighsModelStatus)((ulong)local_5768 >> 0x20));
      uVar11 = std::__cxx11::string::c_str();
      highsLogUser((HighsLogOptions *)pHVar10,kWarning,"LP solved to unexpected status: %s\n",uVar11
                  );
      std::__cxx11::string::~string(local_5768);
      local_4 = kError;
      break;
    case (char *)0x3:
      if ((local_80->super_HighsInfoStruct).basis_validity == 0) {
        highsLogUser((HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380),kWarning,
                     "HighsLpRelaxation::run LP is unbounded with no basis, but not returning Status::kError\n"
                    );
      }
      if ((local_80->super_HighsInfoStruct).primal_solution_status == 2) {
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x608f1d);
        Highs::getSolution((Highs *)(in_RDI + 1));
        HighsMipSolverData::trySolution
                  (in_stack_ffffffffffffa828,in_stack_ffffffffffffa820,solution_source);
      }
      local_4 = kUnbounded;
      break;
    case (char *)0x4:
      in_RDI[0xa73] = in_RDI[0xa73] + 1;
      in_RDI[0xa72] =
           (long)(((double)local_84 - (double)in_RDI[0xa72]) / (double)in_RDI[0xa73] +
                 (double)in_RDI[0xa72]);
      storeDualUBProof(in_stack_ffffffffffffa7b0);
      local_4 = kInfeasible;
      break;
    case (char *)0x6:
      local_4 = kError;
      break;
    case (char *)0x7:
      if (((*(byte *)(*in_RDI + 0xb0) & 1) == 0) && ((uVar2 & 1) != 0)) {
        Highs::Highs(in_stack_ffffffffffffa850);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_52e0,"output_flag",&local_52e1);
        Highs::setOptionValue
                  (in_stack_ffffffffffffa7b8,(string *)in_stack_ffffffffffffa7b0,
                   SUB41((uint)in_stack_ffffffffffffa7ac >> 0x18,0));
        std::__cxx11::string::~string(local_52e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_52e1);
        paVar13 = &local_5309;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5308,"solver",paVar13);
        Highs::setOptionValue(in_stack_ffffffffffffa848,in_stack_ffffffffffffa840,value);
        std::__cxx11::string::~string(local_5308);
        std::allocator<char>::~allocator((allocator<char> *)&local_5309);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5330,"ipm_iteration_limit",&local_5331);
        Highs::setOptionValue
                  (in_stack_ffffffffffffa7b8,(string *)in_stack_ffffffffffffa7b0,
                   in_stack_ffffffffffffa7ac);
        std::__cxx11::string::~string(local_5330);
        std::allocator<char>::~allocator((allocator<char> *)&local_5331);
        if ((*(byte *)(*(long *)(*in_RDI + 8) + 0x378) & 1) != 0) {
          in_stack_ffffffffffffa7f0 = (HighsMipAnalysis *)local_5359;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_5359 + 1),"presolve",(allocator *)in_stack_ffffffffffffa7f0);
          Highs::setOptionValue
                    (in_stack_ffffffffffffa868,in_stack_ffffffffffffa860,in_stack_ffffffffffffa858);
          std::__cxx11::string::~string((string *)(local_5359 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_5359);
        }
        pHVar9 = Highs::getLp((Highs *)(in_RDI + 1));
        HVar3 = (HighsInt)((ulong)pHVar9 >> 0x20);
        HighsLp::HighsLp(in_stack_ffffffffffffa830,(HighsLp *)in_stack_ffffffffffffa828);
        Highs::passModel(in_stack_ffffffffffffafb0,in_stack_ffffffffffffafa8);
        HighsLp::~HighsLp((HighsLp *)in_stack_ffffffffffffa7b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffa8e8,"simplex_iteration_limit",&local_5719);
        Highs::setOptionValue
                  (in_stack_ffffffffffffa7b8,(string *)in_stack_ffffffffffffa7b0,
                   in_stack_ffffffffffffa7ac);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffa8e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5719);
        HighsMipAnalysis::mipTimerStart(in_stack_ffffffffffffa7f0,HVar3);
        Highs::run(in_stack_ffffffffffffa7b8);
        HighsMipAnalysis::mipTimerStop(in_stack_ffffffffffffa7f0,HVar3);
        Highs::getBasis((Highs *)(local_52e0 + 0x20));
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5740,"HighsLpRelaxation::run IPM basis",&local_5741);
        Highs::setBasis(in_stack_ffffffffffffa8f8,(HighsBasis *)in_stack_ffffffffffffa8f0,
                        in_stack_ffffffffffffa8e8);
        std::__cxx11::string::~string(local_5740);
        std::allocator<char>::~allocator((allocator<char> *)&local_5741);
        local_4 = run((HighsLpRelaxation *)CONCAT17(uVar2,in_stack_ffffffffffffffe8),
                      (bool)resolve_on_error_00);
        Highs::~Highs((Highs *)in_stack_ffffffffffffa7b0);
      }
      else {
        local_4 = kError;
      }
      break;
    case (char *)0x8:
      if ((local_80->super_HighsInfoStruct).basis_validity == 0) {
        return kError;
      }
    case (char *)0x0:
      in_RDI[0xa73] = in_RDI[0xa73] + 1;
      in_RDI[0xa72] =
           (long)(((double)local_84 - (double)in_RDI[0xa72]) / (double)in_RDI[0xa73] +
                 (double)in_RDI[0xa72]);
      dVar14 = (local_80->super_HighsInfoStruct).max_primal_infeasibility;
      pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x608fec);
      if (dVar14 <= pHVar8->feastol) {
        dVar14 = (local_80->super_HighsInfoStruct).max_dual_infeasibility;
        pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x60902d);
        if (dVar14 <= pHVar8->feastol) {
          return kOptimal;
        }
      }
      dVar14 = (local_80->super_HighsInfoStruct).max_primal_infeasibility;
      pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x60907b);
      if (pHVar8->feastol < dVar14) {
        dVar14 = (local_80->super_HighsInfoStruct).max_dual_infeasibility;
        pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x6090c9);
        if (pHVar8->feastol < dVar14) {
          if (HVar1 == kOptimal) {
            local_4 = kUnscaledInfeasible;
          }
          else {
            local_4 = kError;
          }
        }
        else {
          local_4 = kUnscaledDualFeasible;
        }
      }
      else {
        local_4 = kUnscaledPrimalFeasible;
      }
    }
    return local_4;
  }
  Highs::clearSolver((Highs *)in_stack_ffffffffffffa7b0);
  if ((uVar2 & 1) != 0) {
    option = (string *)(in_RDI + 1);
    pHVar10 = (Highs *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_a9 + 1),"simplex_strategy",(allocator *)pHVar10);
    Highs::setOptionValue
              (in_stack_ffffffffffffa7b8,(string *)in_stack_ffffffffffffa7b0,
               in_stack_ffffffffffffa7ac);
    std::__cxx11::string::~string((string *)(local_a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
    value_00 = (string *)local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_d1 + 1),"presolve",(allocator *)value_00);
    Highs::setOptionValue(pHVar10,option,value_00);
    std::__cxx11::string::~string((string *)(local_d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d1);
    local_d8 = run((HighsLpRelaxation *)CONCAT17(uVar2,in_stack_ffffffffffffffe8),
                   (bool)resolve_on_error_00);
    paVar13 = &local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"presolve",paVar13);
    Highs::setOptionValue(pHVar10,option,value_00);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    return local_d8;
  }
  recoverBasis(in_stack_ffffffffffffa800);
  return kError;
}

Assistant:

HighsLpRelaxation::Status HighsLpRelaxation::run(bool resolve_on_error) {
  const double this_time_limit =
      std::max(lpsolver.getRunTime() + mipsolver.options_mip_->time_limit -
                   mipsolver.timer_.read(),
               0.0);
  lpsolver.setOptionValue("time_limit", this_time_limit);
  // lpsolver.setOptionValue("output_flag", true);
  const bool valid_basis = lpsolver.getBasis().valid;
  const HighsInt simplex_solve_clock = valid_basis
                                           ? kMipClockSimplexBasisSolveLp
                                           : kMipClockSimplexNoBasisSolveLp;
  const bool dev_report = false;
  if (dev_report && !mipsolver.submip) {
    if (valid_basis) {
      printf("Solving LP (%7d, %7d) with    a valid basis\n",
             int(lpsolver.getNumCol()), int(lpsolver.getNumRow()));
    } else {
      printf("Solving LP (%7d, %7d) without a valid basis\n",
             int(lpsolver.getNumCol()), int(lpsolver.getNumRow()));
    }
  }
  const bool solver_logging = false;
  const bool detailed_simplex_logging = false;
  if (solver_logging) lpsolver.setOptionValue("output_flag", true);
  if (detailed_simplex_logging) {
    lpsolver.setOptionValue("output_flag", true);
    lpsolver.setOptionValue("log_dev_level", kHighsLogDevLevelVerbose);
    lpsolver.setOptionValue("highs_analysis_level",
                            kHighsAnalysisLevelSolverRuntimeData);
  }

  mipsolver.analysis_.mipTimerStart(simplex_solve_clock);
  HighsStatus callstatus = lpsolver.run();
  mipsolver.analysis_.mipTimerStop(simplex_solve_clock);
  if (mipsolver.analysis_.analyse_mip_time && !valid_basis &&
      mipsolver.analysis_.mipTimerNumCall(simplex_solve_clock) == 1)
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "MIP-Timing: %11.2g - return from first root LP solve\n",
                 mipsolver.timer_.read());
  const HighsInfo& info = lpsolver.getInfo();
  HighsInt itercount = std::max(HighsInt{0}, info.simplex_iteration_count);
  numlpiters += itercount;

  if (callstatus == HighsStatus::kError) {
    lpsolver.clearSolver();
#if 0
    // first try to use the primal simplex solver starting from the last basis
    if (lpsolver.getOptions().simplex_strategy == kSimplexStrategyDual) {
      lpsolver.setOptionValue("simplex_strategy", kSimplexStrategyPrimal);
      recoverBasis();
      auto retval = run(resolve_on_error);
      lpsolver.setOptionValue("simplex_strategy", kSimplexStrategyDual);

      return retval;
    }
#endif

    if (resolve_on_error) {
      // still an error: now try to solve with presolve from scratch
      lpsolver.setOptionValue("simplex_strategy", kSimplexStrategyDual);
      lpsolver.setOptionValue("presolve", kHighsOnString);
      auto retval = run(false);
      lpsolver.setOptionValue("presolve", kHighsOffString);

      return retval;
    }

    recoverBasis();

    return Status::kError;
  }

  // Was
  //  HighsModelStatus scaledmodelstatus = lpsolver.getModelStatus(true);
  HighsModelStatus model_status = lpsolver.getModelStatus();
  switch (model_status) {
    case HighsModelStatus::kObjectiveBound:
      ++numSolved;
      avgSolveIters +=
          (itercount - avgSolveIters) / static_cast<double>(numSolved);

      storeDualUBProof();
      return Status::kInfeasible;
    case HighsModelStatus::kInfeasible: {
      ++numSolved;
      avgSolveIters +=
          (itercount - avgSolveIters) / static_cast<double>(numSolved);

      storeDualInfProof();
      if (true || checkDualProof()) return Status::kInfeasible;
      // /printf("infeasibility proof not valid\n");
      hasdualproof = false;

      // HighsInt scalestrategy = lpsolver.getOptions().simplex_scale_strategy;
      // if (scalestrategy != kSimplexScaleStrategyOff) {
      //   lpsolver.setOptionValue("simplex_scale_strategy",
      //                           kSimplexScaleStrategyOff);
      //   HighsBasis basis = lpsolver.getBasis();
      //   lpsolver.clearSolver();
      //   lpsolver.setBasis(basis);
      //   auto tmp = run(resolve_on_error);
      //   lpsolver.setOptionValue("simplex_scale_strategy", scalestrategy);
      //   if (!scaledOptimal(tmp)) {
      //     lpsolver.clearSolver();
      //     lpsolver.setBasis(basis);
      //   }
      //   return tmp;
      // }
      //
      // // trust the primal simplex result without scaling
      // if (lpsolver.getModelStatus() == HighsModelStatus::kInfeasible)
      //   return Status::kInfeasible;

      // highsLogUser(mipsolver.options_mip_->log_options,
      //                 HighsLogType::kWarning,
      //                 "LP failed to reliably determine infeasibility\n");

      // printf("error: unreliable infeasibilities, modelstatus = %"
      // HIGHSINT_FORMAT " (scaled
      // %" HIGHSINT_FORMAT ")\n",
      //        (HighsInt)lpsolver.getModelStatus(),
      //        (HighsInt)lpsolver.getModelStatus(true));
      return Status::kError;
    }
    case HighsModelStatus::kUnbounded:
      // If unboundedness is detected in the presolved LP, then
      // postsolve cannot be run, so there is no basis. Returning
      // Status::kError as a result yielded #1962, where the root node
      // is unbounded.
      if (info.basis_validity == kBasisValidityInvalid)
        highsLogUser(mipsolver.options_mip_->log_options,
                     HighsLogType::kWarning,
                     "HighsLpRelaxation::run LP is unbounded with no basis, "
                     "but not returning Status::kError\n");
      if (info.primal_solution_status == kSolutionStatusFeasible)
        mipsolver.mipdata_->trySolution(lpsolver.getSolution().col_value,
                                        kSolutionSourceUnbounded);

      return Status::kUnbounded;
    case HighsModelStatus::kUnknown:
      if (info.basis_validity == kBasisValidityInvalid) return Status::kError;
      // fall through
    case HighsModelStatus::kOptimal:
      assert(info.max_primal_infeasibility >= 0);
      assert(info.max_dual_infeasibility >= 0);
      ++numSolved;
      avgSolveIters +=
          (itercount - avgSolveIters) / static_cast<double>(numSolved);
      if (info.max_primal_infeasibility <= mipsolver.mipdata_->feastol &&
          info.max_dual_infeasibility <= mipsolver.mipdata_->feastol)
        return Status::kOptimal;

      if (info.max_primal_infeasibility <= mipsolver.mipdata_->feastol)
        return Status::kUnscaledPrimalFeasible;

      if (info.max_dual_infeasibility <= mipsolver.mipdata_->feastol)
        return Status::kUnscaledDualFeasible;

      if (model_status == HighsModelStatus::kOptimal)
        return Status::kUnscaledInfeasible;

      return Status::kError;
    case HighsModelStatus::kIterationLimit: {
      if (!mipsolver.submip && resolve_on_error) {
        // printf(
        //     "error: lpsolver reached iteration limit, resolving with basis "
        //     "from ipm\n");
        Highs ipm;
        ipm.setOptionValue("output_flag", false);
        ipm.setOptionValue("solver", "ipm");
        ipm.setOptionValue("ipm_iteration_limit", 200);
        // check if only root presolve is allowed
        if (mipsolver.options_mip_->mip_root_presolve_only)
          ipm.setOptionValue("presolve", kHighsOffString);
        ipm.passModel(lpsolver.getLp());
        // todo @ Julian : If you remove this you can see the looping on
        // istanbul-no-cutoff
        ipm.setOptionValue("simplex_iteration_limit",
                           info.simplex_iteration_count);
        mipsolver.analysis_.mipTimerStart(kMipClockIpmSolveLp);
        ipm.run();
        mipsolver.analysis_.mipTimerStop(kMipClockIpmSolveLp);
        lpsolver.setBasis(ipm.getBasis(), "HighsLpRelaxation::run IPM basis");
        return run(false);
      }

      // printf("error: lpsolver reached iteration limit\n");
      return Status::kError;
    }
    case HighsModelStatus::kTimeLimit:
      return Status::kError;
    default:
      // printf("error: lpsolver stopped with unexpected status %"
      // HIGHSINT_FORMAT "\n",
      //        (HighsInt)model_status);
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kWarning,
                   "LP solved to unexpected status: %s\n",
                   lpsolver.modelStatusToString(model_status).c_str());
      return Status::kError;
  }
}